

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O2

Gia_Man_t * Gia_ManDupIn2Ff(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = p->vCis->nSize - p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar1 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar1;
  iVar6 = 0;
  if (iVar1 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar1 << 2);
  }
  p_00->pArray = piVar3;
  p_01 = Gia_ManStart(iVar7 * 2 + p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (; iVar6 < p->vCis->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar5 = Gia_ManCi(p,iVar6);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ManAppendCi(p_01);
    Vec_IntPush(p_00,iVar1);
  }
  for (iVar1 = 0; iVar1 < p->nRegs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_01);
    pGVar5->Value = uVar2;
  }
  for (iVar1 = 0; iVar1 < p->vCis->nSize - p->nRegs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCi(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_01);
    pGVar5->Value = uVar2;
  }
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManObj(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar7 = Gia_ObjFanin0Copy(pGVar5);
      iVar6 = Gia_ObjFanin1Copy(pGVar5);
      uVar2 = Gia_ManAppendAnd(p_01,iVar7,iVar6);
      pGVar5->Value = uVar2;
    }
  }
  for (iVar1 = 0; iVar1 < p->vCos->nSize - p->nRegs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCo(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar7 = Gia_ObjFanin0Copy(pGVar5);
    uVar2 = Gia_ManAppendCo(p_01,iVar7);
    pGVar5->Value = uVar2;
  }
  for (iVar1 = 0; iVar1 < p->nRegs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar7 = Gia_ObjFanin0Copy(pGVar5);
    uVar2 = Gia_ManAppendCo(p_01,iVar7);
    pGVar5->Value = uVar2;
  }
  iVar1 = 0;
  do {
    iVar7 = p->vCis->nSize - p->nRegs;
    if (iVar7 <= iVar1) {
LAB_00502bac:
      Gia_ManSetRegNum(p_01,iVar7);
      free(p_00->pArray);
      free(p_00);
      return p_01;
    }
    pGVar5 = Gia_ManCi(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar7 = p->vCis->nSize - p->nRegs;
      goto LAB_00502bac;
    }
    iVar7 = Vec_IntEntry(p_00,iVar1);
    Gia_ManAppendCo(p_01,iVar7);
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Specialized duplication.]

  Description [Replaces registers by PIs/POs and PIs by registers.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDupIn2Ff( Gia_Man_t * p )
{
    Vec_Int_t * vPiOuts;
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i;
    vPiOuts = Vec_IntAlloc( Gia_ManPiNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2 * Gia_ManPiNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPiOuts, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ManAppendCo( pNew, Vec_IntEntry(vPiOuts, i) );
    Gia_ManSetRegNum( pNew, Gia_ManPiNum(p) );
    Vec_IntFree( vPiOuts );
    return pNew;
}